

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

size_t cimg_library::cimg::fread<char>(char *ptr,size_t nmemb,FILE *stream)

{
  CImgArgumentException *this;
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  bool local_89;
  size_t local_88;
  size_t l_al_read;
  size_t l_to_read;
  size_t al_read;
  size_t to_read;
  size_t wlimit;
  size_t wlimitT;
  FILE *stream_local;
  size_t nmemb_local;
  char *ptr_local;
  
  if ((ptr != (char *)0x0) && (stream != (FILE *)0x0)) {
    if (nmemb == 0) {
      ptr_local = (char *)0x0;
    }
    else {
      l_to_read = 0;
      al_read = nmemb;
      do {
        if (al_read < 0x3f00000) {
          local_88 = al_read;
        }
        else {
          local_88 = 0x3f00000;
        }
        sVar2 = fread(ptr + l_to_read,1,local_88,(FILE *)stream);
        l_to_read = sVar2 + l_to_read;
        al_read = al_read - sVar2;
        local_89 = local_88 == sVar2 && al_read != 0;
      } while (local_89);
      ptr_local = (char *)l_to_read;
      if (al_read != 0) {
        warn("cimg::fread(): Only %lu/%lu elements could be read from file.",l_to_read,nmemb);
      }
    }
    return (size_t)ptr_local;
  }
  this = (CImgArgumentException *)__cxa_allocate_exception(0x10);
  pcVar1 = type<char>::string();
  pcVar3 = "";
  if (1 < nmemb) {
    pcVar3 = "s";
  }
  CImgArgumentException::CImgArgumentException
            (this,"cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",
             nmemb,pcVar1,pcVar3,stream,ptr);
  __cxa_throw(this,&CImgArgumentException::typeinfo,CImgArgumentException::~CImgArgumentException);
}

Assistant:

inline size_t fread(T *const ptr, const size_t nmemb, std::FILE *stream) {
      if (!ptr || !stream)
        throw CImgArgumentException("cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",
                                    nmemb,cimg::type<T>::string(),nmemb>1?"s":"",stream,ptr);
      if (!nmemb) return 0;
      const size_t wlimitT = 63*1024*1024, wlimit = wlimitT/sizeof(T);
      size_t to_read = nmemb, al_read = 0, l_to_read = 0, l_al_read = 0;
      do {
        l_to_read = (to_read*sizeof(T))<wlimitT?to_read:wlimit;
        l_al_read = std::fread((void*)(ptr + al_read),sizeof(T),l_to_read,stream);
        al_read+=l_al_read;
        to_read-=l_al_read;
      } while (l_to_read==l_al_read && to_read>0);
      if (to_read>0)
        warn("cimg::fread(): Only %lu/%lu elements could be read from file.",
             (unsigned long)al_read,(unsigned long)nmemb);
      return al_read;
    }